

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O3

int __thiscall dg::pta::PointerGraph::remove(PointerGraph *this,char *__filename)

{
  uint uVar1;
  long *plVar2;
  int iVar3;
  
  uVar1 = *(uint *)(__filename + 8);
  plVar2 = *(long **)(*(long *)(this + 0x10) + (ulong)uVar1 * 8);
  *(undefined8 *)(*(long *)(this + 0x10) + (ulong)uVar1 * 8) = 0;
  if (plVar2 != (long *)0x0) {
    iVar3 = (**(code **)(*plVar2 + 8))();
    return iVar3;
  }
  return uVar1;
}

Assistant:

IDType getID() const { return id; }